

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O0

int get_b64_value(uint8_t character)

{
  int ALPHABET_SIZE;
  uint8_t character_local;
  undefined4 local_4;
  
  if ((character < 0x41) || (0x5a < character)) {
    if ((character < 0x61) || (0x7a < character)) {
      if ((character < 0x30) || (0x39 < character)) {
        if (character == ' ') {
          local_4 = 0x3e;
        }
        else if (character == '\n') {
          local_4 = 0x3f;
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = character + 4;
      }
    }
    else {
      local_4 = character - 0x47;
    }
  }
  else {
    local_4 = character - 0x41;
  }
  return local_4;
}

Assistant:

constexpr int get_b64_value(uint8_t character) {
    constexpr int ALPHABET_SIZE = 'Z' - 'A' + 1;
    if (character >= 'A' && character <= 'Z') {
        return character - 'A';
    } else if (character >= 'a' && character <= 'z') {
        return character - 'a' + ALPHABET_SIZE;
    } else if (character >= '0' && character <= '9') {
        return character - '0' + (2 * ALPHABET_SIZE);
    } else if (character == ' ') {
        return 2 * ALPHABET_SIZE + 10;
    } else if (character == '\n') {
        return 2 * ALPHABET_SIZE + 10 + 1;
    } else {
        return -1;
    }
}